

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

QDistanceFieldData * QDistanceFieldData::create(QSize *size)

{
  bool bVar1;
  int iVar2;
  QDistanceFieldData *pQVar3;
  uchar *puVar4;
  QSize *unaff_retaddr;
  QDistanceFieldData *data;
  QDistanceFieldData *in_stack_fffffffffffffff0;
  
  pQVar3 = (QDistanceFieldData *)operator_new(0x20);
  QDistanceFieldData(in_stack_fffffffffffffff0);
  bVar1 = QSize::isValid(unaff_retaddr);
  if (bVar1) {
    iVar2 = QSize::width((QSize *)0x703586);
    pQVar3->width = iVar2;
    iVar2 = QSize::height((QSize *)0x70359a);
    pQVar3->height = iVar2;
    pQVar3->nbytes = pQVar3->width * pQVar3->height;
    puVar4 = (uchar *)malloc((long)pQVar3->nbytes);
    pQVar3->data = puVar4;
  }
  return pQVar3;
}

Assistant:

QDistanceFieldData *QDistanceFieldData::create(const QSize &size)
{
    QDistanceFieldData *data = new QDistanceFieldData;

    if (size.isValid()) {
        data->width = size.width();
        data->height = size.height();
        // pixel data stored as a 1-byte alpha value
        data->nbytes = data->width * data->height; // tightly packed
        data->data = (uchar *)malloc(data->nbytes);
    }

    return data;
}